

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

ForkedPromise<void> * __thiscall
kj::_::NullableValue<kj::ForkedPromise<void>>::emplace<kj::ForkedPromise<void>>
          (NullableValue<kj::ForkedPromise<void>> *this,ForkedPromise<void> *params)

{
  ForkHub<kj::_::Void> *pFVar1;
  
  if (*this == (NullableValue<kj::ForkedPromise<void>>)0x1) {
    *this = (NullableValue<kj::ForkedPromise<void>>)0x0;
    Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose
              ((Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)(this + 8));
  }
  pFVar1 = (params->hub).ptr;
  *(Disposer **)(this + 8) = (params->hub).disposer;
  *(ForkHub<kj::_::Void> **)(this + 0x10) = pFVar1;
  (params->hub).ptr = (ForkHub<kj::_::Void> *)0x0;
  *this = (NullableValue<kj::ForkedPromise<void>>)0x1;
  return (ForkedPromise<void> *)(this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }